

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AlterBeginAddColumn(Parse *pParse,SrcList *pSrc)

{
  sqlite3 *db_00;
  u8 uVar1;
  int iVar2;
  Table *pTab_00;
  Table *pTVar3;
  Column *pCVar4;
  char *pcVar5;
  ExprList *pEVar6;
  Column *pCol;
  sqlite3 *db;
  int local_30;
  int nAlloc;
  int i;
  int iDb;
  Table *pTab;
  Table *pNew;
  SrcList *pSrc_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  if ((db_00->mallocFailed == '\0') &&
     (pTab_00 = sqlite3LocateTableItem(pParse,0,pSrc->a), pTab_00 != (Table *)0x0)) {
    if (pTab_00->eTabType == '\x01') {
      sqlite3ErrorMsg(pParse,"virtual tables may not be altered");
    }
    else if (pTab_00->eTabType == '\x02') {
      sqlite3ErrorMsg(pParse,"Cannot add a column to a view");
    }
    else {
      iVar2 = isAlterableTable(pParse,pTab_00);
      if (iVar2 == 0) {
        sqlite3MayAbort(pParse);
        iVar2 = sqlite3SchemaToIndex(db_00,pTab_00->pSchema);
        pTVar3 = (Table *)sqlite3DbMallocZero(db_00,0x68);
        if (pTVar3 != (Table *)0x0) {
          pParse->pNewTable = pTVar3;
          pTVar3->nTabRef = 1;
          pTVar3->nCol = pTab_00->nCol;
          pCVar4 = (Column *)
                   sqlite3DbMallocZero(db_00,(long)(((pTVar3->nCol + -1) / 8) * 8 + 8) << 4);
          pTVar3->aCol = pCVar4;
          pcVar5 = sqlite3MPrintf(db_00,"sqlite_altertab_%s",pTab_00->zName);
          pTVar3->zName = pcVar5;
          if ((pTVar3->aCol != (Column *)0x0) && (pTVar3->zName != (char *)0x0)) {
            memcpy(pTVar3->aCol,pTab_00->aCol,(long)pTVar3->nCol << 4);
            for (local_30 = 0; local_30 < pTVar3->nCol; local_30 = local_30 + 1) {
              pCVar4 = pTVar3->aCol + local_30;
              pcVar5 = sqlite3DbStrDup(db_00,pCVar4->zCnName);
              pCVar4->zCnName = pcVar5;
              uVar1 = sqlite3StrIHash(pCVar4->zCnName);
              pCVar4->hName = uVar1;
            }
            pEVar6 = sqlite3ExprListDup(db_00,(pTab_00->u).tab.pDfltList,0);
            (pTVar3->u).tab.pDfltList = pEVar6;
            pTVar3->pSchema = db_00->aDb[iVar2].pSchema;
            (pTVar3->u).tab.addColOffset = (pTab_00->u).tab.addColOffset;
            pTVar3->nTabRef = 1;
          }
        }
      }
    }
  }
  sqlite3SrcListDelete(db_00,pSrc);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterBeginAddColumn(Parse *pParse, SrcList *pSrc){
  Table *pNew;
  Table *pTab;
  int iDb;
  int i;
  int nAlloc;
  sqlite3 *db = pParse->db;

  /* Look up the table being altered. */
  assert( pParse->pNewTable==0 );
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  if( db->mallocFailed ) goto exit_begin_add_column;
  pTab = sqlite3LocateTableItem(pParse, 0, &pSrc->a[0]);
  if( !pTab ) goto exit_begin_add_column;

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "virtual tables may not be altered");
    goto exit_begin_add_column;
  }
#endif

  /* Make sure this is not an attempt to ALTER a view. */
  if( IsView(pTab) ){
    sqlite3ErrorMsg(pParse, "Cannot add a column to a view");
    goto exit_begin_add_column;
  }
  if( SQLITE_OK!=isAlterableTable(pParse, pTab) ){
    goto exit_begin_add_column;
  }

  sqlite3MayAbort(pParse);
  assert( IsOrdinaryTable(pTab) );
  assert( pTab->u.tab.addColOffset>0 );
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);

  /* Put a copy of the Table struct in Parse.pNewTable for the
  ** sqlite3AddColumn() function and friends to modify.  But modify
  ** the name by adding an "sqlite_altertab_" prefix.  By adding this
  ** prefix, we insure that the name will not collide with an existing
  ** table because user table are not allowed to have the "sqlite_"
  ** prefix on their name.
  */
  pNew = (Table*)sqlite3DbMallocZero(db, sizeof(Table));
  if( !pNew ) goto exit_begin_add_column;
  pParse->pNewTable = pNew;
  pNew->nTabRef = 1;
  pNew->nCol = pTab->nCol;
  assert( pNew->nCol>0 );
  nAlloc = (((pNew->nCol-1)/8)*8)+8;
  assert( nAlloc>=pNew->nCol && nAlloc%8==0 && nAlloc-pNew->nCol<8 );
  pNew->aCol = (Column*)sqlite3DbMallocZero(db, sizeof(Column)*nAlloc);
  pNew->zName = sqlite3MPrintf(db, "sqlite_altertab_%s", pTab->zName);
  if( !pNew->aCol || !pNew->zName ){
    assert( db->mallocFailed );
    goto exit_begin_add_column;
  }
  memcpy(pNew->aCol, pTab->aCol, sizeof(Column)*pNew->nCol);
  for(i=0; i<pNew->nCol; i++){
    Column *pCol = &pNew->aCol[i];
    pCol->zCnName = sqlite3DbStrDup(db, pCol->zCnName);
    pCol->hName = sqlite3StrIHash(pCol->zCnName);
  }
  assert( IsOrdinaryTable(pNew) );
  pNew->u.tab.pDfltList = sqlite3ExprListDup(db, pTab->u.tab.pDfltList, 0);
  pNew->pSchema = db->aDb[iDb].pSchema;
  pNew->u.tab.addColOffset = pTab->u.tab.addColOffset;
  pNew->nTabRef = 1;

exit_begin_add_column:
  sqlite3SrcListDelete(db, pSrc);
  return;
}